

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

WId __thiscall QWidget::effectiveWinId(QWidget *this)

{
  QWidget *pQVar1;
  WId WVar2;
  
  WVar2 = this->data->winid;
  if (WVar2 == 0) {
    if (((*(byte *)(*(long *)&this->field_0x8 + 0x243) & 0x10) != 0) &&
       (pQVar1 = nativeParentWidget(this), pQVar1 != (QWidget *)0x0)) {
      return pQVar1->data->winid;
    }
    WVar2 = 0;
  }
  return WVar2;
}

Assistant:

WId QWidget::effectiveWinId() const
{
    const WId id = internalWinId();
    if (id || !testAttribute(Qt::WA_WState_Created))
        return id;
    if (const QWidget *realParent = nativeParentWidget())
        return realParent->internalWinId();
    return 0;
}